

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiArea::showEvent(QMdiArea *this,QShowEvent *showEvent)

{
  QMdiAreaPrivate *this_00;
  long lVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  Rearranger *rearranger;
  long lVar3;
  QWidget *this_01;
  Representation RVar4;
  bool bVar5;
  bool bVar6;
  int iVar7;
  QSize QVar8;
  QWidget *this_02;
  QSize QVar9;
  QSize QVar10;
  long lVar11;
  ulong uVar12;
  long in_FS_OFFSET;
  QSize local_58;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QMdiAreaPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  lVar1 = (this_00->pendingRearrangements).d.size;
  if (lVar1 != 0) {
    local_50.d = (Data *)(this_00->pendingRearrangements).d.d;
    pQVar2 = (QPointer<QMdiSubWindow> *)(this_00->pendingRearrangements).d.ptr;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    bVar6 = false;
    local_50.ptr = pQVar2;
    local_50.size = lVar1;
    for (lVar11 = 0; lVar1 * 8 != lVar11; lVar11 = lVar11 + 8) {
      rearranger = *(Rearranger **)((long)&(pQVar2->wp).d + lVar11);
      iVar7 = (*rearranger->_vptr_Rearranger[1])(rearranger);
      bVar5 = true;
      if (bVar6) {
        bVar5 = bVar6;
      }
      if (iVar7 == 2) {
        bVar5 = bVar6;
      }
      bVar6 = bVar5;
      QMdiAreaPrivate::rearrange(this_00,rearranger);
    }
    QList<QMdi::Rearranger_*>::clear(&this_00->pendingRearrangements);
    if ((bVar6) && ((this_00->pendingPlacements).d.size != 0)) {
      QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
    }
    QArrayDataPointer<QMdi::Rearranger_*>::~QArrayDataPointer
              ((QArrayDataPointer<QMdi::Rearranger_*> *)&local_50);
  }
  lVar1 = (this_00->pendingPlacements).d.size;
  if (lVar1 != 0) {
    local_50.d = (this_00->pendingPlacements).d.d;
    pQVar2 = (this_00->pendingPlacements).d.ptr;
    if (local_50.d != (Data *)0x0) {
      LOCK();
      (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (((Data *)local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_50.ptr = pQVar2;
    local_50.size = lVar1;
    for (lVar11 = 0; lVar1 << 4 != lVar11; lVar11 = lVar11 + 0x10) {
      lVar3 = *(long *)((long)&(pQVar2->wp).d + lVar11);
      if (((lVar3 != 0) && (*(int *)(lVar3 + 4) != 0)) &&
         (this_01 = *(QWidget **)((long)&(pQVar2->wp).value + lVar11), this_01 != (QWidget *)0x0)) {
        if ((this_00->viewMode == TabbedView) &&
           (*(char *)(*(long *)&this_01->field_0x8 + 0x2db) == '\x01')) {
          bVar6 = QPointer::operator_cast_to_bool((QPointer *)&this_00->active);
          if (!bVar6) {
            this_00->showActiveWindowMaximized = true;
            QMdiAreaPrivate::emitWindowActivated(this_00,(QMdiSubWindow *)this_01);
            goto LAB_0040ef6a;
          }
        }
        bVar6 = QWidget::testAttribute_helper(this_01,WA_Resized);
        if (!bVar6) {
          QVar8 = (QSize)(**(code **)(*(long *)this_01 + 0x70))(this_01);
          this_02 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
          QVar9 = QWidget::size(this_02);
          QVar10 = QVar9;
          if (QVar8.wd.m_i.m_i < QVar9.wd.m_i.m_i) {
            QVar10 = QVar8;
          }
          RVar4.m_i = QVar9.ht.m_i.m_i;
          if (QVar8.ht.m_i.m_i < QVar9.ht.m_i.m_i) {
            RVar4.m_i = QVar8.ht.m_i.m_i;
          }
          QVar8 = qSmartMinSize(this_01);
          if (QVar10.wd.m_i.m_i <= QVar8.wd.m_i.m_i) {
            QVar10 = QVar8;
          }
          uVar12 = (ulong)(uint)RVar4.m_i;
          if (RVar4.m_i <= QVar8.ht.m_i.m_i) {
            uVar12 = (ulong)QVar8 >> 0x20;
          }
          local_58 = (QSize)((ulong)QVar10 & 0xffffffff | uVar12 << 0x20);
          QWidget::resize(this_01,&local_58);
        }
        bVar6 = QWidget::testAttribute_helper(this_01,WA_Moved);
        if (!bVar6) {
          bVar6 = QWidget::isMinimized(this_01);
          if (!bVar6) {
            bVar6 = QWidget::isMaximized(this_01);
            if (!bVar6) {
              QMdiAreaPrivate::place(this_00,this_00->placer,(QMdiSubWindow *)this_01);
            }
          }
        }
      }
LAB_0040ef6a:
    }
    QList<QPointer<QMdiSubWindow>_>::clear(&this_00->pendingPlacements);
    QArrayDataPointer<QPointer<QMdiSubWindow>_>::~QArrayDataPointer(&local_50);
  }
  QMdiAreaPrivate::setChildActivationEnabled(this_00,true,false);
  QMdiAreaPrivate::activateCurrentWindow(this_00);
  QWidget::showEvent((QWidget *)this,showEvent);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiArea::showEvent(QShowEvent *showEvent)
{
    Q_D(QMdiArea);
    if (!d->pendingRearrangements.isEmpty()) {
        bool skipPlacement = false;
        // Take a copy because d->rearrange() may modify d->pendingRearrangements
        const auto pendingRearrange = d->pendingRearrangements;
        for (Rearranger *rearranger : pendingRearrange) {
            // If this is the case, we don't have to lay out pending child windows
            // since the rearranger will find a placement for them.
            if (rearranger->type() != Rearranger::IconTiler && !skipPlacement)
                skipPlacement = true;
            d->rearrange(rearranger);
        }
        d->pendingRearrangements.clear();

        if (skipPlacement && !d->pendingPlacements.isEmpty())
            d->pendingPlacements.clear();
    }

    if (!d->pendingPlacements.isEmpty()) {
        // Nothing obvious in the loop body changes the container (in this code path)
        // during iteration, this is calling into a non-const method that does change
        // the container when called from other places. So take a copy anyway for good
        // measure.
        const auto copy = d->pendingPlacements;
        for (QMdiSubWindow *window : copy) {
            if (!window)
                continue;
            if (d->viewMode == TabbedView && window->d_func()->isActive && !d->active) {
                d->showActiveWindowMaximized = true;
                d->emitWindowActivated(window); // Also maximizes the window
                continue;
            }
            if (!window->testAttribute(Qt::WA_Resized)) {
                QSize newSize(window->sizeHint().boundedTo(viewport()->size()));
                window->resize(newSize.expandedTo(qSmartMinSize(window)));
            }
            if (!window->testAttribute(Qt::WA_Moved) && !window->isMinimized()
                    && !window->isMaximized()) {
                d->place(d->placer, window);
            }
        }
        d->pendingPlacements.clear();
    }

    d->setChildActivationEnabled(true);
    d->activateCurrentWindow();

    QAbstractScrollArea::showEvent(showEvent);
}